

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::grabGesture
          (QGraphicsScenePrivate *this,QGraphicsItem *param_2,GestureType gesture)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  undefined4 in_EDX;
  GestureType *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QHash<Qt::GestureType,_int> *in_stack_ffffffffffffffb0;
  undefined1 local_2c [4];
  QGraphicsView **local_28;
  const_iterator local_20;
  const_iterator local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  QGestureManager::instance((InstanceCreation)((ulong)in_RDI >> 0x20));
  piVar3 = QHash<Qt::GestureType,_int>::operator[](in_stack_ffffffffffffffb0,in_RDI);
  iVar1 = *piVar3;
  *piVar3 = iVar1 + 1;
  if (iVar1 == 0) {
    local_18.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QGraphicsView_*>::begin
                         ((QList<QGraphicsView_*> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_20.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QGraphicsView_*>::end
                         ((QList<QGraphicsView_*> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while( true ) {
      local_28 = local_20.i;
      bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_18,local_20);
      if (!bVar2) break;
      QList<QGraphicsView_*>::const_iterator::operator*(&local_18);
      QAbstractScrollArea::viewport
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      in_stack_ffffffffffffffa4 = local_c;
      memset(local_2c,0,4);
      QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0x9cc707);
      QWidget::grabGesture
                ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (GestureType)in_RDI,
                 (QFlagsStorageHelper<Qt::GestureFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0));
      QList<QGraphicsView_*>::const_iterator::operator++(&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::grabGesture(QGraphicsItem *, Qt::GestureType gesture)
{
    (void)QGestureManager::instance(); // create a gesture manager
    if (!grabbedGestures[gesture]++) {
        for (QGraphicsView *view : std::as_const(views))
            view->viewport()->grabGesture(gesture);
    }
}